

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O2

void dill_dump(dill_stream_conflict s)

{
  jmp_table pjVar1;
  int iVar2;
  uint uVar3;
  private_ctx pdVar4;
  uint uVar5;
  char *__s;
  uint *puVar6;
  ulong uVar7;
  uint *puVar8;
  disassemble_info info;
  
  pdVar4 = s->p;
  puVar6 = (uint *)pdVar4->code_base;
  puVar8 = (uint *)(pdVar4->virtual).code_base;
  if ((puVar8 != (uint *)0x0 && puVar6 != puVar8) &&
     (pjVar1 = (pdVar4->virtual).mach_jump, pjVar1 != (jmp_table)0x0)) {
    puVar6 = (uint *)(pdVar4->virtual).cur_ip;
    (*pjVar1->init_disassembly)(s,&info);
    puts("\nDILL virtual instruction stream\n");
    uVar7 = 0;
    for (; puVar8 < puVar6; puVar8 = (uint *)((long)puVar8 + (long)iVar2)) {
      printf("%p  - %x - ",puVar8,(ulong)*puVar8);
      iVar2 = (*((s->p->virtual).mach_jump)->print_insn)(s,&info,puVar8);
      putchar(10);
      if (iVar2 == -1) {
        return;
      }
      uVar7 = (ulong)((int)uVar7 + 1);
    }
    printf("\nDumped %d virtual instructions\n\n",uVar7);
    pdVar4 = s->p;
    puVar6 = (uint *)pdVar4->code_base;
  }
  if ((puVar6 == (uint *)0x0) &&
     (puVar6 = (uint *)(pdVar4->native).code_base, puVar6 == (uint *)0x0)) {
    __s = "No code to dump";
  }
  else {
    iVar2 = (*s->j->init_disassembly)(s,&info);
    if (iVar2 != 0) {
      if ((s->j != (s->p->virtual).mach_jump) && (puVar8 = (uint *)s->p->fp, puVar8 != (uint *)0x0))
      {
        puVar6 = puVar8;
      }
      uVar5 = 0;
      puVar8 = puVar6;
      do {
        pdVar4 = s->p;
        if (pdVar4->cur_ip <= puVar8) {
          printf("\nDumped %d instructions\n\n",(ulong)uVar5);
          return;
        }
        for (uVar7 = 0; (long)uVar7 < (long)(pdVar4->branch_table).next_label; uVar7 = uVar7 + 1) {
          if ((long)puVar8 - (long)puVar6 == (long)(pdVar4->branch_table).label_locs[uVar7]) {
            printf("L%d:\n",uVar7 & 0xffffffff);
          }
        }
        if (puVar8 == (uint *)s->p->fp) {
          puts("Function entry point:");
        }
        printf("%p  - %x - ",puVar8,(ulong)*puVar8);
        uVar3 = (*s->j->print_insn)(s,&info,puVar8);
        putchar(10);
        puVar8 = (uint *)((long)puVar8 + (ulong)uVar3);
        uVar5 = uVar5 + 1;
      } while (0 < (int)uVar3);
      return;
    }
    __s = "No native disassembler available";
  }
  puts(__s);
  return;
}

Assistant:

extern void
dill_dump(dill_stream s)
{
    struct disassemble_info info;
    void* base = s->p->code_base;
    int native_missing = 0;

    if ((base != s->p->virtual.code_base) &&
        (s->p->virtual.code_base != NULL) &&
        (s->p->virtual.mach_jump != NULL)) {
        /* Section to dump virtual code base *after* dcg completion */
        /* only do this if we're not currently in the middle of virtual
         * generation */
        void* code_limit = s->p->virtual.cur_ip;
        base = s->p->virtual.code_base;
        s->p->virtual.mach_jump->init_disassembly(s, &info);
        void* p;
        int l;
        int insn_count = 0;
        printf("\nDILL virtual instruction stream\n\n");
        for (p = base; p < code_limit;) {
            printf("%p  - %x - ", p, (unsigned)*(int*)p);
            l = s->p->virtual.mach_jump->print_insn(s, &info, (void*)p);
            printf("\n");
            if (l == -1)
                return;
            p = (char*)p + l;
            insn_count++;
        }
        printf("\nDumped %d virtual instructions\n\n", insn_count);
    }
#if defined(NO_DISASSEMBLER)
    native_missing = 1;
#endif
    base = s->p->code_base;
    if (base == NULL) {
        base = s->p->native.code_base;
    }
    if (base == NULL) {
        printf("No code to dump\n");
        return;
    }
    /* if ((s->j != s->p->virtual.mach_jump) && native_missing) { */
    /*     printf("No native disassembler available\n"); */
    /*     return; */
    /* } */
    (void)native_missing;
    if (s->j->init_disassembly(s, &info) == 0) {
        printf("No native disassembler available\n");
    } else {
        void* p;
        int l;
        int insn_count = 0;
        if ((s->j != s->p->virtual.mach_jump) && (s->p->fp != NULL))
            base = s->p->fp;
        for (p = base; (char*)p < s->p->cur_ip;) {
            int i;
            struct branch_table* t = &s->p->branch_table;
            for (i = 0; i < t->next_label; i++) {
                if (t->label_locs[i] == ((char*)p - (char*)base)) {
                    printf("L%d:\n", i);
                }
            }
            if (p == s->p->fp) {
                printf("Function entry point:\n");
            }
            printf("%p  - %x - ", p, (unsigned)*(int*)p);
            l = s->j->print_insn(s, &info, (void*)p);
            printf("\n");
            if (l <= 0)
                return;
            p = (char*)p + l;
            insn_count++;
        }
        printf("\nDumped %d instructions\n\n", insn_count);
    }
}